

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,Texture1DArrayView *src,float *texCoord,ReferenceParams *params)

{
  undefined1 local_48 [8];
  Vec4 tq;
  Vec4 sq;
  ReferenceParams *params_local;
  float *texCoord_local;
  Texture1DArrayView *src_local;
  SurfaceAccess *dst_local;
  
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(tq.m_data + 2),*texCoord,texCoord[2],texCoord[4],texCoord[6]);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)local_48,texCoord[1],texCoord[3],texCoord[5],texCoord[7]);
  sampleTextureNonProjected(dst,src,(Vec4 *)(tq.m_data + 2),(Vec4 *)local_48,params);
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::Texture1DArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[2+0], texCoord[4+0], texCoord[6+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[2+1], texCoord[4+1], texCoord[6+1]);

	DE_ASSERT(!(params.flags & ReferenceParams::PROJECTED)); // \todo [2014-06-09 mika] Support projected lookups.
	sampleTextureNonProjected(dst, src, sq, tq, params);
}